

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool __thiscall storage::BTree::_insert_(BTree *this,int key,Record *record)

{
  BTNode *pBVar1;
  int iVar2;
  BTLeafNode *this_00;
  BTInnerNode *this_01;
  BTInnerNode *local_a8;
  BTLeafNode *local_98;
  BTInnerNode *local_88;
  int local_64;
  BTInnerNode *pBStack_60;
  int newk;
  BTInnerNode *rt;
  BTInnerNode *parent;
  BTLeafNode *pBStack_48;
  int kk;
  BTNode *M;
  BTInnerNode *pBStack_38;
  bool err;
  BTNode *node;
  BTLeafNode *t;
  Record *record_local;
  BTree *pBStack_18;
  int key_local;
  BTree *this_local;
  
  t = (BTLeafNode *)record;
  record_local._4_4_ = key;
  pBStack_18 = this;
  if (this->root_ == (BTNode *)0x0) {
    this_00 = (BTLeafNode *)operator_new(0x278);
    BTLeafNode::BTLeafNode(this_00);
    this->root_ = (BTNode *)this_00;
    (this_00->super_BTNode).used_links_count_ = 2;
    (this_00->super_BTNode).keys_[0] = record_local._4_4_;
    this_00->record_links_[0] = t;
    this_00->next_ = (BTLeafNode *)0x0;
    this_local._7_1_ = true;
  }
  else {
    pBStack_38 = (BTInnerNode *)this->root_;
    while (iVar2 = (**(pBStack_38->super_BTNode)._vptr_BTNode)(), (((byte)iVar2 ^ 0xff) & 1) != 0) {
      if (pBStack_38 == (BTInnerNode *)0x0) {
        local_88 = (BTInnerNode *)0x0;
      }
      else {
        local_88 = (BTInnerNode *)
                   __dynamic_cast(pBStack_38,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      BTInnerNode::search_node(local_88,record_local._4_4_,(BTNode **)&stack0xffffffffffffffc8);
    }
    M._7_1_ = 0;
    if (pBStack_38 == (BTInnerNode *)0x0) {
      local_98 = (BTLeafNode *)0x0;
    }
    else {
      local_98 = (BTLeafNode *)__dynamic_cast(pBStack_38,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    }
    pBStack_48 = BTLeafNode::insert_(local_98,record_local._4_4_,t,(bool *)((long)&M + 7));
    if ((M._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      parent._4_4_ = 0;
      if (pBStack_48 != (BTLeafNode *)0x0) {
        parent._4_4_ = (pBStack_48->super_BTNode).keys_[0];
      }
      while (pBStack_48 != (BTLeafNode *)0x0) {
        pBVar1 = (pBStack_38->super_BTNode).parent_;
        if (pBVar1 == (BTNode *)0x0) {
          local_a8 = (BTInnerNode *)0x0;
        }
        else {
          local_a8 = (BTInnerNode *)
                     __dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        }
        rt = local_a8;
        if (local_a8 == (BTInnerNode *)0x0) {
          this_01 = (BTInnerNode *)operator_new(0x278);
          BTInnerNode::BTInnerNode(this_01);
          (this_01->super_BTNode).used_links_count_ = 2;
          (this_01->super_BTNode).keys_[0] = parent._4_4_;
          pBStack_60 = this_01;
          if ((pBStack_38->super_BTNode).keys_[0] < (pBStack_48->super_BTNode).keys_[0]) {
            BTInnerNode::set_link(this_01,0,&pBStack_38->super_BTNode);
            BTInnerNode::set_link(pBStack_60,1,&pBStack_48->super_BTNode);
          }
          else {
            BTInnerNode::set_link(this_01,0,&pBStack_48->super_BTNode);
            BTInnerNode::set_link(pBStack_60,1,&pBStack_38->super_BTNode);
          }
          this->root_ = &pBStack_60->super_BTNode;
          BTInnerNode::resolve_brother(pBStack_60);
          break;
        }
        local_64 = 0;
        pBStack_48 = (BTLeafNode *)
                     BTInnerNode::insert_(local_a8,parent._4_4_,&pBStack_48->super_BTNode,&local_64)
        ;
        parent._4_4_ = local_64;
        pBStack_38 = rt;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BTree::_insert_(int key, Record *record) {
        if (!root_) {
            auto t = new BTLeafNode;
            root_ = t;
            t->used_links_count_ = 2;
            t->keys_[0] = key;
            t->record_links_[0] = record;
            t->next_ = nullptr;
            return true;
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        bool err = false;
        BTNode *M = dynamic_cast<BTLeafNode *>(node)->insert_(key, record, err);
        if (!err) return false; // exists

        int kk = 0;
        if (M) kk = M->keys_[0];
        while (M) {
            BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
            if (!parent) {
                BTInnerNode *rt = new BTInnerNode;
                rt->used_links_count_ = 2;
                rt->keys_[0] = kk;
                if (node->keys_[0] < M->keys_[0]) {
                    rt->set_link(0, node);//rt->links_[0] = node;
                    rt->set_link(1, M);//rt->links_[1] = M;
                } else {
                    rt->set_link(0, M);//rt->links_[0] = M;
                    rt->set_link(1, node);//rt->links_[1] = node;
                }
                root_ = rt;
                rt->resolve_brother();
                break;
            } else {
                int newk = 0;
                M = parent->insert_(kk, M, newk);
                kk = newk;
                node = parent;
            }
        }
        return true;
    }